

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_int rf_get_ktx_image_size(void *src,rf_int src_size)

{
  ulong uVar1;
  _Bool _Var2;
  rf_int rVar3;
  rf_ktx_header header;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  ulong uStack_20;
  
  if (0x3f < (ulong)src_size && src != (void *)0x0) {
    local_58 = *src;
    uStack_50 = *(undefined8 *)((long)src + 8);
    local_48 = *(undefined8 *)((long)src + 0x10);
    uStack_40 = *(undefined8 *)((long)src + 0x18);
    local_38 = *(undefined8 *)((long)src + 0x20);
    uStack_30 = *(undefined8 *)((long)src + 0x28);
    local_28 = *(undefined8 *)((long)src + 0x30);
    uStack_20 = *(ulong *)((long)src + 0x38);
    uVar1 = uStack_20 >> 0x20;
    _Var2 = rf_match_str_cstr((char *)((long)&local_58 + 1),6,"KTX 11");
    rVar3 = 0;
    if ((_Var2) && (4 < (src_size - uVar1) - 0x40)) {
      rVar3 = (rf_int)*(int *)((long)src + uVar1 + 0x40);
    }
    return rVar3;
  }
  return 0;
}

Assistant:

RF_API rf_int rf_get_ktx_image_size(const void* src, rf_int src_size)
{
    int result = 0;

    if (src && src_size >= sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&result, src, sizeof(unsigned int));
            }
        }
    }

    return result;
}